

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector_test.cc
# Opt level: O0

void __thiscall
fizplex::DVectorSVectorDotProductTest_ZeroVectors_Test::TestBody
          (DVectorSVectorDotProductTest_ZeroVectors_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  double in_stack_00000340;
  double in_stack_00000348;
  char *in_stack_00000350;
  char *in_stack_00000358;
  size_t in_stack_ffffffffffffff78;
  DVector *in_stack_ffffffffffffff80;
  AssertHelper local_68;
  Message local_60;
  SVector *in_stack_ffffffffffffffa8;
  DVector *in_stack_ffffffffffffffb0;
  AssertionResult local_18;
  
  DVector::DVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  SVector::SVector((SVector *)in_stack_ffffffffffffff80);
  DVector::operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000340);
  SVector::~SVector((SVector *)0x1b570e);
  DVector::~DVector((DVector *)0x1b5718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1b5797);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector_test.cc"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x1b57e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b5825);
  return;
}

Assistant:

TEST(DVectorSVectorDotProductTest, ZeroVectors) {
  EXPECT_DOUBLE_EQ(0.0, DVector(5) * SVector());
}